

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoveGeneration.h
# Opt level: O2

void __thiscall
libchess::Position::generate_capture_promotions(Position *this,MoveList *move_list,Color stm)

{
  ulong uVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  
  uVar1 = this->color_bb_[stm.super_MetaValueType<int>.value_ == 0].value_;
  for (uVar6 = this->color_bb_[(int)stm.super_MetaValueType<int>.value_].value_ &
               this->piece_type_bb_[0].value_ &
               *(ulong *)(lookups::RANK_MASK +
                         (ulong)((uint)(stm.super_MetaValueType<int>.value_ == 0) * 0x28) + 8);
      uVar6 != 0; uVar6 = uVar6 & uVar6 - 1) {
    lVar2 = 0;
    if (uVar6 != 0) {
      for (; (uVar6 >> lVar2 & 1) == 0; lVar2 = lVar2 + 1) {
      }
    }
    for (uVar7 = *(ulong *)(lookups::PAWN_ATTACKS +
                           lVar2 * 8 + (long)(int)stm.super_MetaValueType<int>.value_ * 0x200) &
                 uVar1; uVar7 != 0; uVar7 = uVar7 & uVar7 - 1) {
      lVar3 = 0;
      if (uVar7 != 0) {
        for (; (uVar7 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
        }
      }
      iVar5 = (int)lVar3 * 0x40;
      iVar4 = (int)lVar2;
      MoveList::add(move_list,(Move)(iVar5 + iVar4 + 0x3c000));
      MoveList::add(move_list,(Move)(iVar5 + iVar4 + 0x39000));
      MoveList::add(move_list,(Move)(iVar5 + iVar4 + 0x3b000));
      MoveList::add(move_list,(Move)(iVar5 + iVar4 + 0x3a000));
    }
  }
  return;
}

Assistant:

inline void Position::generate_capture_promotions(MoveList& move_list, Color stm) const {
    Bitboard pawn_bb = piece_type_bb(constants::PAWN);
    pawn_bb &= color_bb(stm) & lookups::relative_rank_mask(constants::RANK_7, stm);
    Bitboard opp_occupancy = color_bb(!stm);
    while (pawn_bb) {
        Square from_sq = pawn_bb.forward_bitscan();
        pawn_bb.forward_popbit();
        Bitboard attacks_bb = lookups::pawn_attacks(from_sq, stm) & opp_occupancy;
        while (attacks_bb) {
            Square to_sq = attacks_bb.forward_bitscan();
            attacks_bb.forward_popbit();
            move_list.add(Move{from_sq, to_sq, constants::QUEEN, Move::Type::CAPTURE_PROMOTION});
            move_list.add(Move{from_sq, to_sq, constants::KNIGHT, Move::Type::CAPTURE_PROMOTION});
            move_list.add(Move{from_sq, to_sq, constants::ROOK, Move::Type::CAPTURE_PROMOTION});
            move_list.add(Move{from_sq, to_sq, constants::BISHOP, Move::Type::CAPTURE_PROMOTION});
        }
    }
}